

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::DescriptorScriptPubKeyMan::Encrypt
          (DescriptorScriptPubKeyMan *this,CKeyingMaterial *master_key,WalletBatch *batch)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  void *__dest;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  long lVar6;
  uint256 *puVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  size_t __n;
  long in_FS_OFFSET;
  byte bVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> crypted_secret;
  CKeyingMaterial secret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  CPubKey pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_128;
  unique_lock<std::recursive_mutex> local_108;
  CKeyID local_f4;
  uint256 local_e0 [2];
  uchar local_a0;
  void *local_98;
  void *pvStack_90;
  long local_88;
  CPubKey local_79;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_108._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_108);
  if ((this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    p_Var4 = (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        CKey::GetPubKey(&local_79,(CKey *)&p_Var4[1]._M_right);
        lVar6 = *(long *)(p_Var4 + 2);
        local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,secure_allocator<unsigned_char>>::
        _M_range_initialize<unsigned_char_const*>
                  ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_128,lVar6,
                   (ulong)(lVar6 != 0) * 0x20 + lVar6);
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CPubKey::GetHash(local_e0,&local_79);
        bVar2 = EncryptSecret(master_key,(CKeyingMaterial *)&local_128,local_e0,&local_148);
        if (!bVar2) {
          if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_148.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_148.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                    (&local_128);
          goto LAB_002269cf;
        }
        memcpy(local_e0,&local_79,0x41);
        local_98 = (void *)0x0;
        pvStack_90 = (void *)0x0;
        local_88 = 0;
        uVar9 = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (uVar9 == 0) {
          __dest = (void *)0x0;
        }
        else {
          if ((long)uVar9 < 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar5 = std::__throw_bad_alloc();
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar5);
              }
            }
            goto LAB_00226d1e;
          }
          __dest = operator_new(uVar9);
        }
        local_88 = uVar9 + (long)__dest;
        __n = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_98 = __dest;
        if (__n != 0) {
          pvStack_90 = __dest;
          memmove(__dest,local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        }
        pvStack_90 = (void *)((long)__dest + __n);
        CPubKey::GetID(&local_f4,&local_79);
        pmVar3 = std::
                 map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ::operator[](&this->m_map_crypted_keys,&local_f4);
        puVar7 = local_e0;
        pmVar8 = pmVar3;
        for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined8 *)(pmVar8->first).vch =
               *(undefined8 *)(puVar7->super_base_blob<256U>).m_data._M_elems;
          puVar7 = (uint256 *)((long)puVar7 + (ulong)bVar10 * -0x10 + 8);
          pmVar8 = (mapped_type *)((long)pmVar8 + (ulong)bVar10 * -0x10 + 8);
        }
        (pmVar3->first).vch[0x40] = local_a0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&pmVar3->second,&local_98);
        if (local_98 != (void *)0x0) {
          operator_delete(local_98,local_88 - (long)local_98);
        }
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_e0,this);
        WalletBatch::WriteCryptedDescriptorKey(batch,local_e0,&local_79,&local_148);
        if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                  (&local_128);
        if (!bVar2) goto LAB_002269cf;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::clear(&(this->m_map_keys)._M_t);
    bVar2 = true;
  }
  else {
LAB_002269cf:
    bVar2 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_00226d1e:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::Encrypt(const CKeyingMaterial& master_key, WalletBatch* batch)
{
    LOCK(cs_desc_man);
    if (!m_map_crypted_keys.empty()) {
        return false;
    }

    for (const KeyMap::value_type& key_in : m_map_keys)
    {
        const CKey &key = key_in.second;
        CPubKey pubkey = key.GetPubKey();
        CKeyingMaterial secret{UCharCast(key.begin()), UCharCast(key.end())};
        std::vector<unsigned char> crypted_secret;
        if (!EncryptSecret(master_key, secret, pubkey.GetHash(), crypted_secret)) {
            return false;
        }
        m_map_crypted_keys[pubkey.GetID()] = make_pair(pubkey, crypted_secret);
        batch->WriteCryptedDescriptorKey(GetID(), pubkey, crypted_secret);
    }
    m_map_keys.clear();
    return true;
}